

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

tuple __thiscall
pybind11::
make_tuple<(pybind11::return_value_policy)1,pybind11::handle,pybind11::handle,pybind11::none,pybind11::str>
          (pybind11 *this,handle *args_,handle *args__1,none *args__2,str *args__3)

{
  PyObject *pPVar1;
  undefined8 uVar2;
  handle *phVar3;
  runtime_error *this_00;
  long *plVar4;
  long *plVar5;
  long lVar6;
  array<pybind11::object,_4UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  argtypes;
  handle local_100;
  PyObject *local_f8;
  PyObject *local_f0;
  PyObject *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [4];
  
  pPVar1 = args_->m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_100.m_ptr = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_100 = (handle)args_->m_ptr;
  }
  pPVar1 = args__1->m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_f8 = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_f8 = args__1->m_ptr;
  }
  pPVar1 = (args__2->super_object).super_handle.m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_f0 = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_f0 = (args__2->super_object).super_handle.m_ptr;
  }
  pPVar1 = (args__3->super_object).super_handle.m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_e8 = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_e8 = (args__3->super_object).super_handle.m_ptr;
  }
  phVar3 = &local_100;
  lVar6 = 0;
  do {
    if (phVar3->m_ptr == (PyObject *)0x0) {
      type_id<pybind11::handle>();
      type_id<pybind11::handle>();
      type_id<pybind11::none>();
      type_id<pybind11::str>();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_e0,"make_tuple(): unable to convert argument of type \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_a0 - lVar6));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
      local_c0 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_c0 == plVar5) {
        local_b0 = *plVar5;
        lStack_a8 = plVar4[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar5;
      }
      local_b8 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_c0);
      *(undefined ***)this_00 = &PTR__runtime_error_00125a40;
      __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar6 = lVar6 + -0x20;
    phVar3 = phVar3 + 1;
  } while (lVar6 != -0x80);
  tuple::tuple((tuple *)this,4);
  lVar6 = 0;
  do {
    uVar2 = *(undefined8 *)((long)&local_100.m_ptr + lVar6);
    *(undefined8 *)((long)&local_100.m_ptr + lVar6) = 0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/cast.h"
                    ,0x658,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::handle, pybind11::handle, pybind11::none, pybind11::str>]"
                   );
    }
    *(undefined8 *)(*(long *)this + 0x18 + lVar6) = uVar2;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  lVar6 = 0x18;
  do {
    object::~object((object *)((long)&local_100.m_ptr + lVar6));
    lVar6 = lVar6 + -8;
  } while (lVar6 != -8);
  return (object)(object)this;
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}